

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O0

void __thiscall
TasGrid::GridLocalPolynomial::expandGrid<(TasGrid::RuleLocal::erule)2>
          (GridLocalPolynomial *this,vector<int,_std::allocator<int>_> *point,
          vector<double,_std::allocator<double>_> *value)

{
  pointer *this_00;
  allocator<double> *paVar1;
  bool bVar2;
  int iVar3;
  const_reference pvVar4;
  reference pvVar5;
  double *pdVar6;
  double *pdVar7;
  iterator iVar8;
  iterator iVar9;
  const_iterator cVar10;
  iterator iVar11;
  reference pvVar12;
  MultiIndexSet *mset;
  double dVar13;
  Data2D<int> local_278;
  int local_250;
  int local_24c;
  int j_1;
  int l;
  int *pnt;
  int *g_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<int,_std::allocator<int>_> *__range3_1;
  undefined1 local_218 [8];
  vector<int,_std::allocator<int>_> levels;
  int *g;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  undefined1 local_1d8 [4];
  int newindex;
  MultiIndexSet local_1c0;
  undefined1 local_198 [8];
  vector<int,_std::allocator<int>_> graph;
  allocator<double> local_149;
  undefined1 local_148 [8];
  vector<double,_std::allocator<double>_> surp;
  undefined1 local_128 [8];
  vector<double,_std::allocator<double>_> approximation;
  int j;
  vector<double,_std::allocator<double>_> xnode;
  Data2D<double> local_d8;
  vector<double,_std::allocator<double>_> local_b0;
  StorageSet local_98;
  vector<int,_std::allocator<int>_> local_60;
  MultiIndexSet local_48;
  vector<double,_std::allocator<double>_> *local_20;
  vector<double,_std::allocator<double>_> *value_local;
  vector<int,_std::allocator<int>_> *point_local;
  GridLocalPolynomial *this_local;
  
  local_20 = value;
  value_local = (vector<double,_std::allocator<double>_> *)point;
  point_local = (vector<int,_std::allocator<int>_> *)this;
  bVar2 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).points);
  if (bVar2) {
    iVar3 = (this->super_BaseCanonicalGrid).num_dimensions;
    ::std::vector<int,_std::allocator<int>_>::vector
              (&local_60,(vector<int,_std::allocator<int>_> *)value_local);
    MultiIndexSet::MultiIndexSet(&local_48,(long)iVar3,&local_60);
    MultiIndexSet::operator=(&(this->super_BaseCanonicalGrid).points,&local_48);
    MultiIndexSet::~MultiIndexSet(&local_48);
    ::std::vector<int,_std::allocator<int>_>::~vector(&local_60);
    iVar3 = (this->super_BaseCanonicalGrid).num_outputs;
    ::std::vector<double,_std::allocator<double>_>::vector
              (&local_b0,(vector<double,_std::allocator<double>_> *)local_20);
    StorageSet::StorageSet(&local_98,iVar3,1,&local_b0);
    StorageSet::operator=(&(this->super_BaseCanonicalGrid).values,&local_98);
    StorageSet::~StorageSet(&local_98);
    ::std::vector<double,_std::allocator<double>_>::~vector(&local_b0);
    iVar3 = (this->super_BaseCanonicalGrid).num_outputs;
    this_00 = &xnode.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    ::std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)this_00,
               (vector<double,_std::allocator<double>_> *)local_20);
    Data2D<double>::Data2D<int,int>
              (&local_d8,iVar3,1,(vector<double,_std::allocator<double>_> *)this_00);
    Data2D<double>::operator=(&this->surpluses,&local_d8);
    Data2D<double>::~Data2D(&local_d8);
    ::std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               &xnode.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  else {
    iVar3 = (this->super_BaseCanonicalGrid).num_dimensions;
    paVar1 = (allocator<double> *)
             ((long)&approximation.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    ::std::allocator<double>::allocator(paVar1);
    ::std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&j,(long)iVar3,paVar1);
    ::std::allocator<double>::~allocator
              ((allocator<double> *)
               ((long)&approximation.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    for (approximation.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        (int)approximation.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage <
        (this->super_BaseCanonicalGrid).num_dimensions;
        approximation.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (int)approximation.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 1) {
      pvVar4 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)value_local,
                          (long)(int)approximation.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage);
      dVar13 = RuleLocal::getNode<(TasGrid::RuleLocal::erule)2>(*pvVar4);
      pvVar5 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&j,
                          (long)(int)approximation.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage);
      *pvVar5 = dVar13;
    }
    iVar3 = (this->super_BaseCanonicalGrid).num_outputs;
    paVar1 = (allocator<double> *)
             ((long)&surp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    ::std::allocator<double>::allocator(paVar1);
    ::std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_128,(long)iVar3,paVar1);
    ::std::allocator<double>::~allocator
              ((allocator<double> *)
               ((long)&surp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    iVar3 = (this->super_BaseCanonicalGrid).num_outputs;
    ::std::allocator<double>::allocator(&local_149);
    ::std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_148,(long)iVar3,&local_149);
    ::std::allocator<double>::~allocator(&local_149);
    pdVar6 = ::std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)&j);
    pdVar7 = ::std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)local_128);
    (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x10])(this,pdVar6,pdVar7);
    iVar8 = ::std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)local_128);
    iVar9 = ::std::vector<double,_std::allocator<double>_>::end
                      ((vector<double,_std::allocator<double>_> *)local_128);
    cVar10 = ::std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)local_20);
    iVar11 = ::std::vector<double,_std::allocator<double>_>::begin
                       ((vector<double,_std::allocator<double>_> *)local_148);
    graph.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)::std::
                  transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,TasGrid::GridLocalPolynomial::expandGrid<(TasGrid::RuleLocal::erule)2>(std::vector<int,std::allocator<int>>const&,std::vector<double,std::allocator<double>>const&)::_lambda(double,double)_1_>
                            (iVar8._M_current,iVar9._M_current,cVar10._M_current,iVar11._M_current);
    getSubGraph<(TasGrid::RuleLocal::erule)2>
              ((vector<int,_std::allocator<int>_> *)local_198,this,
               (vector<int,_std::allocator<int>_> *)value_local);
    iVar3 = (this->super_BaseCanonicalGrid).num_dimensions;
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_1d8,
               (vector<int,_std::allocator<int>_> *)value_local);
    MultiIndexSet::MultiIndexSet
              (&local_1c0,(long)iVar3,(vector<int,_std::allocator<int>_> *)local_1d8);
    pdVar6 = ::std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)local_20);
    StorageSet::addValues
              (&(this->super_BaseCanonicalGrid).values,&(this->super_BaseCanonicalGrid).points,
               &local_1c0,pdVar6);
    MultiIndexSet::~MultiIndexSet(&local_1c0);
    ::std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)local_1d8);
    MultiIndexSet::addSortedIndexes
              (&(this->super_BaseCanonicalGrid).points,
               (vector<int,_std::allocator<int>_> *)value_local);
    iVar3 = MultiIndexSet::getSlot
                      (&(this->super_BaseCanonicalGrid).points,
                       (vector<int,_std::allocator<int>_> *)value_local);
    Data2D<double>::appendStrip
              (&this->surpluses,iVar3,(vector<double,_std::allocator<double>_> *)local_148);
    __end3._M_current =
         (int *)::std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_198);
    g = (int *)::std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_198);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)&g);
      if (!bVar2) break;
      levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (&__end3);
      if (iVar3 <= *levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
        *levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage =
             *levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage + 1;
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end3);
    }
    iVar3 = MultiIndexSet::getNumIndexes(&(this->super_BaseCanonicalGrid).points);
    __range3_1._4_4_ = 0;
    ::std::allocator<int>::allocator((allocator<int> *)((long)&__range3_1 + 3));
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_218,(long)iVar3,
               (value_type_conflict3 *)((long)&__range3_1 + 4),
               (allocator<int> *)((long)&__range3_1 + 3));
    ::std::allocator<int>::~allocator((allocator<int> *)((long)&__range3_1 + 3));
    __end3_1._M_current =
         (int *)::std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_198);
    g_1 = (int *)::std::vector<int,_std::allocator<int>_>::end
                           ((vector<int,_std::allocator<int>_> *)local_198);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end3_1,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&g_1);
      if (!bVar2) break;
      pnt = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                      (&__end3_1);
      _j_1 = MultiIndexSet::getIndex(&(this->super_BaseCanonicalGrid).points,*pnt);
      local_24c = RuleLocal::getLevel<(TasGrid::RuleLocal::erule)2>(*_j_1);
      for (local_250 = 1; iVar3 = local_24c,
          local_250 < (this->super_BaseCanonicalGrid).num_dimensions; local_250 = local_250 + 1) {
        iVar3 = RuleLocal::getLevel<(TasGrid::RuleLocal::erule)2>(_j_1[local_250]);
        local_24c = iVar3 + local_24c;
      }
      pvVar12 = ::std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_218,(long)*pnt);
      *pvVar12 = iVar3;
      pdVar6 = StorageSet::getValues(&(this->super_BaseCanonicalGrid).values,*pnt);
      iVar3 = (this->super_BaseCanonicalGrid).num_outputs;
      pdVar7 = Data2D<double>::getStrip(&this->surpluses,*pnt);
      ::std::copy_n<double*,int,double*>(pdVar6,iVar3,pdVar7);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end3_1);
    }
    mset = &(this->super_BaseCanonicalGrid).points;
    iVar3 = this->top_level;
    HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)2>(&local_278,mset);
    updateSurpluses<(TasGrid::RuleLocal::erule)2>
              (this,mset,iVar3 + 1,(vector<int,_std::allocator<int>_> *)local_218,&local_278);
    Data2D<int>::~Data2D(&local_278);
    ::std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)local_218);
    ::std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)local_198);
    ::std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_148);
    ::std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_128);
    ::std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)&j);
  }
  buildTree(this);
  return;
}

Assistant:

void GridLocalPolynomial::expandGrid(const std::vector<int> &point, const std::vector<double> &value){
    if (points.empty()){ // only one point
        points = MultiIndexSet((size_t) num_dimensions, std::vector<int>(point));
        values = StorageSet(num_outputs, 1, std::vector<double>(value));
        surpluses = Data2D<double>(num_outputs, 1, std::vector<double>(value)); // one value is its own surplus
    }else{ // merge with existing points
        // compute the surplus for the point
        std::vector<double> xnode(num_dimensions);
        for(int j=0; j<num_dimensions; j++)
            xnode[j] = RuleLocal::getNode<effrule>(point[j]);

        std::vector<double> approximation(num_outputs), surp(num_outputs);
        evaluate(xnode.data(), approximation.data());
        std::transform(approximation.begin(), approximation.end(), value.begin(), surp.begin(), [&](double e, double v)->double{ return v - e; });

        std::vector<int> graph = getSubGraph<effrule>(point); // get the descendant nodes that must be updated later

        values.addValues(points, MultiIndexSet(num_dimensions, std::vector<int>(point)), value.data()); // added the value

        points.addSortedIndexes(point); // add the point
        int newindex = points.getSlot(point);
        surpluses.appendStrip(newindex, surp); // find the index of the new point

        for(auto &g : graph) if (g >= newindex) g++; // all points belowe the newindex have been shifted down by one spot

        std::vector<int> levels(points.getNumIndexes(), 0); // compute the levels, but only for the new indexes
        for(auto &g : graph){
            int const *pnt = points.getIndex(g);
            int l = RuleLocal::getLevel<effrule>(pnt[0]);
            for(int j=1; j<num_dimensions; j++) l += RuleLocal::getLevel<effrule>(pnt[j]);
            levels[g] = l;

            std::copy_n(values.getValues(g), num_outputs, surpluses.getStrip(g)); // reset the surpluses to the values (will be updated)
        }

        // compute the current DAG and update the surplused for the descendants
        updateSurpluses<effrule>(points, top_level + 1, levels, HierarchyManipulations::computeDAGup<effrule>(points));
    }
    buildTree(); // the tree is needed for evaluate(), must be rebuild every time the points set is updated
}